

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::execute
          (DuplicateColsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_3,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_4,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  type_conflict5 tVar1;
  bool bVar2;
  int *piVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  VarStatus *pVVar5;
  undefined8 uVar6;
  ulong *puVar7;
  SPxInternalCodeException *this_00;
  VarStatus VVar8;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_R9;
  byte in_stack_00000010;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  int cIdx;
  int cIdx_new;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_42;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_42;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_35;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_35;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_22;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_22;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_15;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_15;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_46;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_46;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_45;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_45;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_43;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_43;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_41;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_41;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_39;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_36;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_36;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_34;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_34;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_32;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_32;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_31;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_31;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_29;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_28;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_26;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_26;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_25;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_25;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_23;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_23;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_21;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_21;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_19;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_19;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_16;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_16;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_14;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_44;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_44;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_40;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_37;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_37;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_33;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_33;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_30;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_27;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_27;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_24;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_24;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_20;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_17;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffc438;
  int iVar9;
  cpp_dec_float<100U,_int,_void> *u;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffc440;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffc448;
  allocator *paVar10;
  undefined4 in_stack_ffffffffffffc450;
  undefined4 in_stack_ffffffffffffc454;
  self_type *in_stack_ffffffffffffc458;
  self_type *val;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffc460;
  type_conflict5 local_3b6d;
  type_conflict5 local_3b45;
  undefined4 in_stack_ffffffffffffc4d8;
  undefined4 in_stack_ffffffffffffc4dc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffc4e0;
  long *plVar11;
  double in_stack_ffffffffffffc4f0;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffc4f8;
  type_conflict5 local_3afd;
  undefined4 in_stack_ffffffffffffc530;
  undefined4 in_stack_ffffffffffffc534;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffc538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffc540;
  type_conflict5 local_3a8d;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffc580;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffc588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffc590;
  undefined4 in_stack_ffffffffffffc598;
  undefined4 in_stack_ffffffffffffc59c;
  type_conflict5 local_3a45;
  type_conflict5 local_3a1d;
  type_conflict5 local_39d9;
  bool local_39c2;
  bool local_39c1;
  bool local_39aa;
  bool local_39a9;
  undefined1 local_392c [82];
  undefined1 local_38da;
  allocator local_38d9;
  string local_38d8 [32];
  undefined1 local_38b8 [80];
  undefined1 local_3868 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3818;
  undefined1 local_37c8 [80];
  undefined1 local_3778 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3728;
  undefined1 local_36d8 [80];
  ulong local_3688;
  undefined1 local_3680 [80];
  undefined1 local_3630 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_35e0;
  undefined1 local_3590 [80];
  undefined1 local_3540 [80];
  undefined1 local_34f0 [80];
  undefined1 local_34a0 [80];
  undefined1 local_3450 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3400;
  undefined1 local_33b0 [80];
  undefined1 local_3360 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3310;
  undefined1 local_32c0 [80];
  undefined1 local_3270 [80];
  undefined1 local_3220 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_31d0;
  undefined1 local_3180 [80];
  undefined1 local_3130 [80];
  undefined1 local_30e0 [80];
  ulong local_3090;
  undefined1 local_3084 [80];
  undefined1 local_3034 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2fe4;
  undefined1 local_2f94 [80];
  undefined1 local_2f44 [80];
  undefined1 local_2ef4 [80];
  undefined1 local_2ea4 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e54;
  undefined1 local_2e04 [80];
  undefined1 local_2db4 [82];
  undefined1 local_2d62;
  allocator local_2d61;
  string local_2d60 [32];
  undefined1 local_2d40 [80];
  undefined1 local_2cf0 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2ca0;
  undefined1 local_2c50 [80];
  undefined1 local_2c00 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2bb0;
  undefined1 local_2b60 [80];
  ulong local_2b10;
  undefined1 local_2b08 [80];
  undefined1 local_2ab8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a68;
  undefined1 local_2a18 [80];
  undefined1 local_29c8 [80];
  undefined1 local_2978 [80];
  ulong local_2928;
  undefined1 local_2920 [80];
  undefined1 local_28d0 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2880;
  undefined1 local_2830 [80];
  undefined1 local_27e0 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2790;
  undefined1 local_2740 [80];
  undefined1 local_26f0 [80];
  undefined1 local_26a0 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2650;
  undefined1 local_2600 [80];
  undefined1 local_25b0 [80];
  undefined1 local_2560 [80];
  undefined1 local_2510 [80];
  undefined1 local_24c0 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2470;
  undefined1 local_2420 [80];
  undefined1 local_23d0 [80];
  undefined1 local_2380 [80];
  undefined1 local_2330 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_22e0;
  undefined1 local_2290 [80];
  undefined1 local_2240 [80];
  undefined8 local_21f0;
  undefined8 local_21e8;
  undefined1 local_21e0 [80];
  ulong local_2190;
  undefined1 local_2188 [80];
  undefined1 local_2138 [80];
  ulong local_20e8;
  undefined1 local_20e0 [80];
  undefined8 local_2090;
  undefined1 local_2088 [80];
  undefined1 local_2038 [80];
  undefined8 local_1fe8;
  undefined1 local_1fe0 [80];
  undefined1 local_1f90 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1ef0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1ea0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1db0;
  undefined8 local_1d60;
  undefined8 local_1d58;
  undefined8 local_1d50;
  undefined8 local_1d48;
  undefined1 local_1d3c [80];
  undefined1 local_1cec [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c9c;
  undefined1 local_1c4c [80];
  undefined1 local_1bfc [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1bac;
  undefined1 local_1b5a;
  allocator local_1b59;
  string local_1b58 [32];
  undefined1 local_1b38 [80];
  undefined8 local_1ae8;
  undefined1 local_1ae0 [80];
  undefined1 local_1a90 [80];
  undefined1 local_1a40 [80];
  undefined8 local_19f0;
  undefined1 local_19e8 [80];
  undefined1 local_1998 [80];
  undefined1 local_1948 [80];
  undefined1 local_18f8 [80];
  undefined1 local_18a8 [80];
  undefined1 local_1858 [80];
  undefined1 local_1808 [80];
  undefined1 local_17b8 [80];
  undefined1 local_1768 [80];
  undefined1 local_1718 [80];
  undefined8 local_16c8;
  undefined1 local_16bd;
  allocator local_16a9;
  string local_16a8 [32];
  undefined1 local_1688 [80];
  undefined8 local_1638;
  undefined1 local_1630 [80];
  undefined1 local_15e0 [80];
  undefined1 local_1590 [80];
  undefined8 local_1540;
  undefined1 local_1538 [80];
  undefined1 local_14e8 [80];
  undefined1 local_1498 [80];
  undefined1 local_1448 [80];
  undefined1 local_13f8 [80];
  undefined1 local_13a8 [80];
  undefined1 local_1358 [80];
  undefined1 local_1308 [80];
  undefined1 local_12b8 [80];
  undefined1 local_1268 [80];
  undefined4 local_1218;
  undefined4 local_1214;
  int local_1210;
  int local_120c;
  int local_1208;
  byte local_1201;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_1200;
  undefined8 local_11d0;
  undefined8 *local_11c8;
  undefined1 *local_11c0;
  undefined8 local_11b8;
  undefined8 *local_11b0;
  undefined1 *local_11a8;
  undefined8 local_11a0;
  undefined8 *local_1198;
  undefined1 *local_1190;
  undefined8 local_1188;
  undefined8 *local_1180;
  undefined1 *local_1178;
  undefined8 local_1170;
  ulong *local_1168;
  undefined1 *local_1160;
  undefined8 local_1158;
  undefined8 local_1150;
  undefined1 *local_1148;
  undefined8 local_1140;
  ulong *local_1138;
  undefined1 *local_1130;
  undefined8 local_1128;
  undefined8 local_1120;
  undefined1 *local_1118;
  undefined8 local_1110;
  undefined8 local_1108;
  undefined1 *local_1100;
  undefined8 local_10f8;
  undefined8 local_10f0;
  undefined1 *local_10e8;
  undefined8 local_10e0;
  ulong *local_10d8;
  undefined1 *local_10d0;
  undefined8 local_10c8;
  ulong *local_10c0;
  undefined1 *local_10b8;
  undefined8 local_10b0;
  ulong *local_10a8;
  undefined1 *local_10a0;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined1 *local_1088;
  undefined8 local_1080;
  undefined8 local_1078;
  undefined1 *local_1070;
  undefined8 local_1068;
  ulong *local_1060;
  undefined1 *local_1058;
  long *local_1050;
  undefined1 *local_1048;
  long *local_1040;
  undefined1 *local_1038;
  long *local_1030;
  undefined1 *local_1028;
  long *local_1020;
  undefined1 *local_1018;
  long *local_1010;
  undefined1 *local_1008;
  long *local_1000;
  undefined1 *local_ff8;
  long *local_ff0;
  undefined1 *local_fe8;
  long *local_fe0;
  undefined1 *local_fd8;
  long *local_fd0;
  undefined1 *local_fc8;
  long *local_fc0;
  undefined1 *local_fb8;
  long *local_fb0;
  undefined1 *local_fa8;
  long *local_fa0;
  undefined1 *local_f98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f90;
  undefined1 *local_f88;
  long *local_f80;
  undefined1 *local_f78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f70;
  undefined1 *local_f68;
  long *local_f60;
  undefined1 *local_f58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f50;
  undefined1 *local_f48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f40;
  undefined1 *local_f38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f30;
  undefined1 *local_f28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f20;
  undefined1 *local_f18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f10;
  undefined1 *local_f08;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f00;
  undefined1 *local_ef8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ef0;
  undefined1 *local_ee8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ee0;
  undefined1 *local_ed8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ed0;
  undefined1 *local_ec8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ec0;
  undefined1 *local_eb8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_eb0;
  undefined1 *local_ea8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ea0;
  undefined1 *local_e98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e90;
  undefined1 *local_e88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e80;
  undefined1 *local_e78;
  undefined1 *local_e70;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e68;
  undefined1 *local_e60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e58;
  undefined1 *local_e50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e48;
  undefined1 *local_e40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e38;
  undefined1 *local_e30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e28;
  self_type *local_e20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e18;
  long *local_e10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e08;
  long *local_e00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_df8;
  long *local_df0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_de8;
  long *local_de0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_dd8;
  long *local_dd0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_dc8;
  long *local_dc0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_db8;
  long *local_db0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_da8;
  long *local_da0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d98;
  long *local_d90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d88;
  long *local_d80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d78;
  long *local_d70;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d68;
  long *local_d60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d58;
  long *local_d50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d48;
  long *local_d40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d38;
  long *local_d30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d28;
  long *local_d20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d18;
  long *local_d10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d08;
  long *local_d00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_cf8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_cf0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ce8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ce0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_cd8;
  ulong *local_cd0;
  undefined8 local_cc8;
  undefined8 local_cc0;
  ulong *local_cb8;
  ulong *local_cb0;
  ulong *local_ca8;
  undefined8 local_ca0;
  undefined8 local_c98;
  undefined8 local_c90;
  ulong *local_c88;
  undefined8 local_c80;
  ulong *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c49;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c20;
  undefined1 *local_c18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c09;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c08;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_be8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_be0;
  undefined1 *local_bd8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_bc9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bc8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ba8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ba0;
  undefined1 *local_b98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b89;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b60;
  undefined1 *local_b58;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b49;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b40;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b09;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b08;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_af8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_af0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ae8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ae0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ad8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_ac9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ac8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ac0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ab8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_aa8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_aa0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a89;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a70;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a58;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a49;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a48;
  cpp_dec_float<100U,_int,_void> *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a28;
  cpp_dec_float<100U,_int,_void> *local_a20;
  undefined1 *local_a18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a09;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a08;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9e0;
  undefined1 *local_9d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_9c9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_998;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_989;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_988;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_980;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_978;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_970;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_968;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_960;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_958;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_949;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_948;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_940;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_938;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_930;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_928;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_920;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_918;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_909;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_908;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8e0;
  undefined1 *local_8d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_8c9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_898;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_889;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_888;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_880;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_878;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_870;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_868;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_860;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_858;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_849;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_848;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_840;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_838;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_830;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_828;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_820;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_818;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_809;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_808;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7e0;
  undefined1 *local_7d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_7c9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_798;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_789;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_788;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_768;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_760;
  undefined1 *local_758;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_749;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_748;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_740;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_738;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_730;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_728;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_720;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_718;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_709;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_708;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e0;
  undefined1 *local_6d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_6c9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_698;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_689;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_688;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_680;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_670;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_668;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_660;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_658;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_649;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_648;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_640;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_638;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_630;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_620;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_618;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_609;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_608;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5e0;
  undefined1 *local_5d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_5c9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_598;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_589;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_570;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_568;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_560;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_549;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_548;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_540;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_530;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_528;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_520;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_518;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_509;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_508;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e0;
  undefined1 *local_4d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_4c9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_489;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_488;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_468;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  undefined1 *local_458;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_449;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_438;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_430;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  undefined8 *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  undefined8 *local_388;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_379;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_339;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2f9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  undefined1 *local_2c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  undefined1 *local_288;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_279;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  undefined1 *local_248;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_239;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  undefined1 *local_208;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  undefined1 *local_1c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_1201 = in_stack_00000010 & 1;
  if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
    local_1200 = in_R9;
    if ((*(byte *)((long)in_RDI + 0x1c1) & 1) == 0) {
      pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_R9,*(int *)((long)in_RDI + 0x2c));
      if (*pVVar5 == ON_LOWER) {
        local_cf8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffc440,
                                 (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
        local_d00 = in_RDI + 0x1a;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
        local_1214 = 0;
        tVar1 = boost::multiprecision::operator>
                          (in_stack_ffffffffffffc448,(int *)in_stack_ffffffffffffc440);
        iVar9 = (int)((ulong)in_stack_ffffffffffffc438 >> 0x20);
        if (tVar1) {
          local_d08 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffc440,iVar9);
          local_d10 = in_RDI + 6;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
          bVar2 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffc438,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x5a18e8);
          VVar8 = ON_LOWER;
          if (bVar2) {
            VVar8 = FIXED;
          }
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,(int)in_RDI[5]);
          *pVVar5 = VVar8;
        }
        else {
          local_d18 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffc440,iVar9);
          local_d20 = in_RDI + 0x10;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
          bVar2 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffc438,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x5a199e);
          VVar8 = ON_UPPER;
          if (bVar2) {
            VVar8 = FIXED;
          }
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,(int)in_RDI[5]);
          *pVVar5 = VVar8;
        }
      }
      else {
        pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
        if (*pVVar5 == ON_UPPER) {
          local_d28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffc440,
                                   (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
          local_d30 = in_RDI + 0x24;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
          local_1218 = 0;
          tVar1 = boost::multiprecision::operator>
                            (in_stack_ffffffffffffc448,(int *)in_stack_ffffffffffffc440);
          iVar9 = (int)((ulong)in_stack_ffffffffffffc438 >> 0x20);
          if (tVar1) {
            local_d38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffc440,iVar9);
            local_d40 = in_RDI + 0x10;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
            bVar2 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffc438,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x5a1afc);
            VVar8 = ON_UPPER;
            if (bVar2) {
              VVar8 = FIXED;
            }
            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](local_1200,(int)in_RDI[5]);
            *pVVar5 = VVar8;
          }
          else {
            local_d48 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffc440,iVar9);
            local_d50 = in_RDI + 6;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
            bVar2 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffc438,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x5a1bac);
            VVar8 = ON_LOWER;
            if (bVar2) {
              VVar8 = FIXED;
            }
            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](local_1200,(int)in_RDI[5]);
            *pVVar5 = VVar8;
          }
        }
        else {
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
          if (*pVVar5 == FIXED) {
            local_d58 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffc440,
                                     (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
            local_d60 = in_RDI + 6;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](local_1200,(int)in_RDI[5]);
            *pVVar5 = FIXED;
          }
          else {
            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
            if (*pVVar5 == ZERO) {
              local_1050 = in_RDI + 0x1a;
              local_1048 = local_1268;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
              (**(code **)(*in_RDI + 0x38))(local_12b8);
              bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_ffffffffffffc4e0,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8));
              local_39a9 = false;
              if (bVar2) {
                local_1040 = in_RDI + 0x24;
                local_1038 = local_1308;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                (**(code **)(*in_RDI + 0x38))(local_1358);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffc4e0,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8))
                ;
                local_39a9 = false;
                if (bVar2) {
                  local_39a9 = boost::multiprecision::operator==
                                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)in_stack_ffffffffffffc438,
                                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)0x5a1db6);
                }
              }
              if (local_39a9 == false) {
                local_1030 = in_RDI + 0x1a;
                local_1028 = local_13a8;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                (**(code **)(*in_RDI + 0x38))(local_13f8);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffc4e0,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8))
                ;
                if (bVar2) {
                  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                           ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                  *pVVar5 = ON_LOWER;
                }
                else {
                  local_1020 = in_RDI + 0x24;
                  local_1018 = local_1448;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                            (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                  (**(code **)(*in_RDI + 0x38))(local_1498);
                  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (in_stack_ffffffffffffc4e0,
                                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8
                                                ));
                  if (bVar2) {
                    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                    *pVVar5 = ON_UPPER;
                  }
                  else {
                    local_1010 = in_RDI + 0x1a;
                    local_1008 = local_14e8;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                    local_1540 = 0;
                    local_11c0 = local_1538;
                    local_11c8 = &local_1540;
                    local_11d0 = 0;
                    local_c58 = local_11c8;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<100U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                               (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                    (**(code **)(*in_RDI + 0x38))(local_1590);
                    bVar2 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffc540,in_stack_ffffffffffffc538,
                                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)CONCAT44(in_stack_ffffffffffffc534,
                                                   in_stack_ffffffffffffc530));
                    local_39aa = false;
                    if (bVar2) {
                      local_1000 = in_RDI + 0x24;
                      local_ff8 = local_15e0;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                      local_1638 = 0;
                      local_11a8 = local_1630;
                      local_11b0 = &local_1638;
                      local_11b8 = 0;
                      local_c60 = local_11b0;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                      cpp_dec_float<double>
                                ((cpp_dec_float<100U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                                 (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                      (**(code **)(*in_RDI + 0x38))(local_1688);
                      local_39aa = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                             (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                              in_stack_ffffffffffffc580);
                    }
                    if (local_39aa == false) {
                      local_16bd = 1;
                      uVar6 = __cxa_allocate_exception(0x28);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_16a8,"XMAISM05 This should never happen.",&local_16a9);
                      SPxInternalCodeException::SPxInternalCodeException
                                ((SPxInternalCodeException *)in_stack_ffffffffffffc440,
                                 (string *)in_stack_ffffffffffffc438);
                      local_16bd = 0;
                      __cxa_throw(uVar6,&SPxInternalCodeException::typeinfo,
                                  SPxInternalCodeException::~SPxInternalCodeException);
                    }
                    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                    *pVVar5 = ZERO;
                  }
                }
              }
              else {
                pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                         ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                *pVVar5 = FIXED;
              }
              local_16c8 = 0;
              local_390 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffc440,
                                       (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
              local_398 = &local_16c8;
              local_388 = local_398;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        (in_stack_ffffffffffffc4f8,in_stack_ffffffffffffc4f0);
              local_ff0 = in_RDI + 6;
              local_fe8 = local_1718;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
              (**(code **)(*in_RDI + 0x38))(local_1768);
              bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_ffffffffffffc4e0,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8));
              local_39c1 = false;
              if (bVar2) {
                local_fe0 = in_RDI + 0x10;
                local_fd8 = local_17b8;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                (**(code **)(*in_RDI + 0x38))(local_1808);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffc4e0,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8))
                ;
                local_39c1 = false;
                if (bVar2) {
                  local_39c1 = boost::multiprecision::operator==
                                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)in_stack_ffffffffffffc438,
                                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)0x5a2362);
                }
              }
              if (local_39c1 == false) {
                local_fd0 = in_RDI + 6;
                local_fc8 = local_1858;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                (**(code **)(*in_RDI + 0x38))(local_18a8);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffc4e0,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8))
                ;
                if (bVar2) {
                  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                           ::operator[](local_1200,(int)in_RDI[5]);
                  *pVVar5 = ON_LOWER;
                }
                else {
                  local_fc0 = in_RDI + 0x10;
                  local_fb8 = local_18f8;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                            (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                  (**(code **)(*in_RDI + 0x38))(local_1948);
                  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (in_stack_ffffffffffffc4e0,
                                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8
                                                ));
                  if (bVar2) {
                    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[](local_1200,(int)in_RDI[5]);
                    *pVVar5 = ON_UPPER;
                  }
                  else {
                    local_fb0 = in_RDI + 6;
                    local_fa8 = local_1998;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                    local_19f0 = 0;
                    local_1190 = local_19e8;
                    local_1198 = &local_19f0;
                    local_11a0 = 0;
                    local_c68 = local_1198;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<100U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                               (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                    (**(code **)(*in_RDI + 0x38))(local_1a40);
                    bVar2 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffc540,in_stack_ffffffffffffc538,
                                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)CONCAT44(in_stack_ffffffffffffc534,
                                                   in_stack_ffffffffffffc530));
                    local_39c2 = false;
                    if (bVar2) {
                      local_fa0 = in_RDI + 0x10;
                      local_f98 = local_1a90;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                      local_1ae8 = 0;
                      local_1178 = local_1ae0;
                      local_1180 = &local_1ae8;
                      local_1188 = 0;
                      local_c70 = local_1180;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                      cpp_dec_float<double>
                                ((cpp_dec_float<100U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                                 (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                      (**(code **)(*in_RDI + 0x38))(local_1b38);
                      local_39c2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                             (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                              in_stack_ffffffffffffc580);
                    }
                    if (local_39c2 == false) {
                      local_1b5a = 1;
                      uVar6 = __cxa_allocate_exception(0x28);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_1b58,"XMAISM06 This should never happen.",&local_1b59);
                      SPxInternalCodeException::SPxInternalCodeException
                                ((SPxInternalCodeException *)in_stack_ffffffffffffc440,
                                 (string *)in_stack_ffffffffffffc438);
                      local_1b5a = 0;
                      __cxa_throw(uVar6,&SPxInternalCodeException::typeinfo,
                                  SPxInternalCodeException::~SPxInternalCodeException);
                    }
                    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[](local_1200,(int)in_RDI[5]);
                    *pVVar5 = ZERO;
                  }
                }
              }
              else {
                pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                         ::operator[](local_1200,(int)in_RDI[5]);
                *pVVar5 = FIXED;
              }
            }
            else {
              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                       ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
              if (*pVVar5 == BASIC) {
                local_f90 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffc440,
                                         (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                local_f88 = local_1bfc;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                local_f80 = in_RDI + 0x1a;
                local_f78 = local_1c4c;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                maxAbs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffc59c,in_stack_ffffffffffffc598),
                           in_stack_ffffffffffffc590);
                local_f70 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffc440,
                                         (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                local_f68 = local_1cec;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                local_f60 = in_RDI + 0x24;
                local_f58 = local_1d3c;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                maxAbs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffc59c,in_stack_ffffffffffffc598),
                           in_stack_ffffffffffffc590);
                local_1d48 = 0x3ff0000000000000;
                tVar1 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffc438,(double *)0x5a291f);
                if (tVar1) {
                  local_1d50 = 0x3ff0000000000000;
                  local_3a8 = &local_1bac;
                  local_3b0 = &local_1d50;
                  local_3a0 = local_3b0;
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            (in_stack_ffffffffffffc4f8,in_stack_ffffffffffffc4f0);
                }
                local_1d58 = 0x3ff0000000000000;
                tVar1 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffc438,(double *)0x5a29a5);
                if (tVar1) {
                  local_1d60 = 0x3ff0000000000000;
                  local_3c0 = &local_1c9c;
                  local_3c8 = &local_1d60;
                  local_3b8 = local_3c8;
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            (in_stack_ffffffffffffc4f8,in_stack_ffffffffffffc4f0);
                }
                local_a80 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffc440,
                                         (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                local_a78 = &local_1e00;
                local_a88 = &local_1bac;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_a89,local_a80,local_a88);
                local_a70 = &local_1e00;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440);
                local_a58 = &local_1e00;
                local_a60 = local_a80;
                local_a68 = local_a88;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                           (cpp_dec_float<100U,_int,_void> *)0x5a2acc);
                local_ac0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(in_RDI + 0x1a);
                local_ab8 = &local_1e50;
                local_ac8 = &local_1bac;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_ac9,local_ac0,local_ac8);
                local_ab0 = &local_1e50;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440);
                local_a98 = &local_1e50;
                local_aa0 = local_ac0;
                local_aa8 = local_ac8;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                           (cpp_dec_float<100U,_int,_void> *)0x5a2b89);
                local_328 = &local_1db0;
                local_330 = &local_1e00;
                local_338 = &local_1e50;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_339,local_330,local_338);
                local_320 = &local_1db0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440);
                local_308 = &local_1db0;
                local_310 = local_330;
                local_318 = local_338;
                boost::multiprecision::default_ops::
                eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                           (cpp_dec_float<100U,_int,_void> *)0x5a2c40);
                local_b00 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffc440,
                                         (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                local_af8 = &local_1ef0;
                local_b08 = &local_1c9c;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_b09,local_b00,local_b08);
                local_af0 = &local_1ef0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440);
                local_ad8 = &local_1ef0;
                local_ae0 = local_b00;
                local_ae8 = local_b08;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                           (cpp_dec_float<100U,_int,_void> *)0x5a2d07);
                local_b40 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(in_RDI + 0x24);
                local_b38 = &local_1f40;
                local_b48 = &local_1c9c;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_b49,local_b40,local_b48);
                local_b30 = &local_1f40;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440);
                local_b18 = &local_1f40;
                local_b20 = local_b40;
                local_b28 = local_b48;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                           (cpp_dec_float<100U,_int,_void> *)0x5a2dc4);
                local_368 = &local_1ea0;
                local_370 = &local_1ef0;
                local_378 = &local_1f40;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_379,local_370,local_378);
                local_360 = &local_1ea0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440);
                local_348 = &local_1ea0;
                local_350 = local_370;
                local_358 = local_378;
                boost::multiprecision::default_ops::
                eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                           (cpp_dec_float<100U,_int,_void> *)0x5a2e7b);
                local_f48 = local_1f90;
                local_f50 = &local_1db0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                (**(code **)(*in_RDI + 0x38))(local_1fe0);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffc4e0,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8))
                ;
                if (bVar2) {
                  local_1fe8 = 0;
                  local_3d8 = &local_1db0;
                  local_3e0 = &local_1fe8;
                  local_3d0 = local_3e0;
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            (in_stack_ffffffffffffc4f8,in_stack_ffffffffffffc4f0);
                }
                local_f38 = local_2038;
                local_f40 = &local_1ea0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                (**(code **)(*in_RDI + 0x38))(local_2088);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffc4e0,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffc4dc,in_stack_ffffffffffffc4d8))
                ;
                if (bVar2) {
                  local_2090 = 0;
                  local_3f0 = &local_1ea0;
                  local_3f8 = &local_2090;
                  local_3e8 = local_3f8;
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            (in_stack_ffffffffffffc4f8,in_stack_ffffffffffffc4f0);
                }
                puVar7 = (ulong *)infinity();
                local_20e8 = *puVar7 ^ 0x8000000000000000;
                local_1160 = local_20e0;
                local_1168 = &local_20e8;
                local_1170 = 0;
                local_c78 = local_1168;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<100U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                           (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                tVar1 = boost::multiprecision::operator<=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffc438,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x5a309c);
                local_39d9 = false;
                if (tVar1) {
                  local_1150 = infinity();
                  local_1148 = local_2138;
                  local_1158 = 0;
                  local_c80 = local_1150;
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<100U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                             (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                  tVar1 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffc438,
                                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x5a3132);
                  local_39d9 = false;
                  if (tVar1) {
                    puVar7 = (ulong *)infinity();
                    local_2190 = *puVar7 ^ 0x8000000000000000;
                    local_1130 = local_2188;
                    local_1138 = &local_2190;
                    local_1140 = 0;
                    local_c88 = local_1138;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<100U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                               (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                    tVar1 = boost::multiprecision::operator<=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)in_stack_ffffffffffffc438,
                                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)0x5a31f4);
                    local_39d9 = false;
                    if (tVar1) {
                      local_1120 = infinity();
                      local_1118 = local_21e0;
                      local_1128 = 0;
                      local_c90 = local_1120;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                      cpp_dec_float<double>
                                ((cpp_dec_float<100U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                                 (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                      local_39d9 = boost::multiprecision::operator>=
                                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)in_stack_ffffffffffffc438,
                                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)0x5a328a);
                    }
                  }
                }
                if (local_39d9 == false) {
                  local_21f0 = 0;
                  tVar1 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffc438,(double *)0x5a3354);
                  iVar9 = (int)((ulong)in_stack_ffffffffffffc438 >> 0x20);
                  if (tVar1) {
                    local_f30 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              *)in_stack_ffffffffffffc440,iVar9);
                    local_f28 = local_2240;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                    local_440 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x2e);
                    local_448 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x10);
                    local_438 = &local_22e0;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_449,local_440,local_448);
                    local_430 = &local_22e0;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffc440);
                    local_418 = &local_22e0;
                    local_420 = local_440;
                    local_428 = local_448;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                              (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                               (cpp_dec_float<100U,_int,_void> *)0x5a3473);
                    local_28 = local_2290;
                    local_38 = &local_22e0;
                    local_30 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(in_RDI + 0x24);
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_39,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(in_RDI + 0x24),local_38);
                    local_20 = local_2290;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffc440);
                    local_8 = local_2290;
                    local_10 = local_30;
                    local_18 = local_38;
                    boost::multiprecision::default_ops::
                    eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                              (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                               (cpp_dec_float<100U,_int,_void> *)0x5a352a);
                    (**(code **)(*in_RDI + 0x38))(local_2330);
                    bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                       in_stack_ffffffffffffc580);
                    if (bVar2) {
                      bVar2 = boost::multiprecision::operator==
                                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)in_stack_ffffffffffffc438,
                                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)0x5a3581);
                      VVar8 = ON_UPPER;
                      if (bVar2) {
                        VVar8 = FIXED;
                      }
                      pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                               ::operator[](local_1200,(int)in_RDI[5]);
                      *pVVar5 = VVar8;
                      local_d68 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffc440,
                                               (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                      local_d70 = in_RDI + 0x10;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                      local_488 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffc440,
                                               (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                      local_478 = local_2380;
                      local_480 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x2e);
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_489,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x2e),local_488);
                      local_470 = local_2380;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440);
                      local_458 = local_2380;
                      local_460 = local_480;
                      local_468 = local_488;
                      boost::multiprecision::default_ops::
                      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                 (cpp_dec_float<100U,_int,_void> *)0x5a36f0);
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffc440,
                                   (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                      boost::multiprecision::
                      number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      ::operator-=(in_stack_ffffffffffffc460,in_stack_ffffffffffffc458);
                    }
                    else {
                      local_f20 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffc440,
                                               (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                      local_f18 = local_23d0;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                      local_4c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x2e);
                      local_4c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x10);
                      local_4b8 = &local_2470;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_4c9,local_4c0,local_4c8);
                      local_4b0 = &local_2470;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440);
                      local_498 = &local_2470;
                      local_4a0 = local_4c0;
                      local_4a8 = local_4c8;
                      boost::multiprecision::default_ops::
                      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                 (cpp_dec_float<100U,_int,_void> *)0x5a3833);
                      local_68 = local_2420;
                      local_78 = &local_2470;
                      local_70 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x1a);
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_79,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x1a),local_78);
                      local_60 = local_2420;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440);
                      local_48 = local_2420;
                      local_50 = local_70;
                      local_58 = local_78;
                      boost::multiprecision::default_ops::
                      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                 (cpp_dec_float<100U,_int,_void> *)0x5a38ea);
                      (**(code **)(*in_RDI + 0x38))(local_24c0);
                      bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                         in_stack_ffffffffffffc580);
                      local_3a1d = false;
                      if (bVar2) {
                        local_1108 = infinity();
                        local_1100 = local_2510;
                        local_1110 = 0;
                        local_c98 = local_1108;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<100U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                                   (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                        local_3a1d = boost::multiprecision::operator<
                                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)in_stack_ffffffffffffc438,
                                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)0x5a39b3);
                      }
                      if (local_3a1d == false) {
                        local_f10 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                 (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                        local_f08 = local_25b0;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                        local_540 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x2e);
                        local_548 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 6);
                        local_538 = &local_2650;
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_549,local_540,local_548);
                        local_530 = &local_2650;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffc440);
                        local_518 = &local_2650;
                        local_520 = local_540;
                        local_528 = local_548;
                        boost::multiprecision::default_ops::
                        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                   (cpp_dec_float<100U,_int,_void> *)0x5a3c95);
                        local_a8 = local_2600;
                        local_b8 = &local_2650;
                        local_b0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x24);
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_b9,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x24),local_b8);
                        local_a0 = local_2600;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffc440);
                        local_88 = local_2600;
                        local_90 = local_b0;
                        local_98 = local_b8;
                        boost::multiprecision::default_ops::
                        eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                   (cpp_dec_float<100U,_int,_void> *)0x5a3d4c);
                        (**(code **)(*in_RDI + 0x38))(local_26a0);
                        bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                          (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                           in_stack_ffffffffffffc580);
                        local_3a45 = false;
                        if (bVar2) {
                          local_10f0 = infinity();
                          local_10e8 = local_26f0;
                          local_10f8 = 0;
                          local_ca0 = local_10f0;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<100U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                                     (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                          local_3a45 = boost::multiprecision::operator<
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffc438,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x5a3e15);
                        }
                        if (local_3a45 == false) {
                          local_f00 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                          local_ef8 = local_27e0;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                          pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x1a);
                          local_5c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x2e);
                          local_5c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 6);
                          local_5b8 = &local_2880;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_5c9,local_5c0,local_5c8);
                          local_5b0 = &local_2880;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440);
                          local_598 = &local_2880;
                          local_5a0 = local_5c0;
                          local_5a8 = local_5c8;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                     (cpp_dec_float<100U,_int,_void> *)0x5a41d0);
                          local_e8 = local_2830;
                          local_f8 = &local_2880;
                          local_f0 = pnVar4;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_f9,pnVar4,local_f8);
                          local_e0 = local_2830;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440);
                          local_c8 = local_2830;
                          local_d0 = local_f0;
                          local_d8 = local_f8;
                          boost::multiprecision::default_ops::
                          eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                     (cpp_dec_float<100U,_int,_void> *)0x5a4287);
                          (**(code **)(*in_RDI + 0x38))(local_28d0);
                          bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                            (pnVar4,in_stack_ffffffffffffc588,
                                             in_stack_ffffffffffffc580);
                          tVar1 = false;
                          if (bVar2) {
                            in_stack_ffffffffffffc588 =
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 6);
                            puVar7 = (ulong *)infinity();
                            local_2928 = *puVar7 ^ 0x8000000000000000;
                            local_10d0 = local_2920;
                            local_10d8 = &local_2928;
                            local_10e0 = 0;
                            local_ca8 = local_10d8;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<100U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450)
                                       ,(double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440)
                            ;
                            tVar1 = boost::multiprecision::operator>
                                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)in_stack_ffffffffffffc438,
                                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)0x5a437a);
                          }
                          if (tVar1 == false) {
                            local_ef0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                            local_ee8 = local_29c8;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                            local_640 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x2e);
                            local_648 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 6);
                            local_638 = &local_2a68;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_649,local_640,local_648);
                            local_630 = &local_2a68;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffc440);
                            local_618 = &local_2a68;
                            local_620 = local_640;
                            local_628 = local_648;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                       (cpp_dec_float<100U,_int,_void> *)0x5a465c);
                            local_128 = local_2a18;
                            local_138 = &local_2a68;
                            local_130 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x1a);
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_139,
                                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0x1a),local_138);
                            local_120 = local_2a18;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffc440);
                            local_108 = local_2a18;
                            local_110 = local_130;
                            local_118 = local_138;
                            boost::multiprecision::default_ops::
                            eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                       (cpp_dec_float<100U,_int,_void> *)0x5a4713);
                            (**(code **)(*in_RDI + 0x38))(local_2ab8);
                            bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                              (pnVar4,in_stack_ffffffffffffc588,
                                               in_stack_ffffffffffffc580);
                            local_3a8d = false;
                            if (bVar2) {
                              puVar7 = (ulong *)infinity();
                              local_2b10 = *puVar7 ^ 0x8000000000000000;
                              local_10b8 = local_2b08;
                              local_10c0 = &local_2b10;
                              local_10c8 = 0;
                              local_cb0 = local_10c0;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float<double>
                                        ((cpp_dec_float<100U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffc454,
                                                  in_stack_ffffffffffffc450),
                                         (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440
                                        );
                              local_3a8d = boost::multiprecision::operator>
                                                     ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffc438,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x5a4808);
                            }
                            if (local_3a8d == false) {
                              local_ee0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_ed8 = local_2c00;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                              local_6c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x2e);
                              local_6c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 6);
                              local_6b8 = &local_2ca0;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_6c9,local_6c0,local_6c8);
                              local_6b0 = &local_2ca0;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_698 = &local_2ca0;
                              local_6a0 = local_6c0;
                              local_6a8 = local_6c8;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a4bc6);
                              local_168 = local_2c50;
                              local_178 = &local_2ca0;
                              local_170 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x1a);
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_179,
                                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)(in_RDI + 0x1a),local_178);
                              local_160 = local_2c50;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_148 = local_2c50;
                              local_150 = local_170;
                              local_158 = local_178;
                              boost::multiprecision::default_ops::
                              eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a4c7d);
                              (**(code **)(*in_RDI + 0x38))(local_2cf0);
                              bVar2 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                                (pnVar4,in_stack_ffffffffffffc588,
                                                 in_stack_ffffffffffffc580);
                              if (!bVar2) {
                                local_2d62 = 1;
                                uVar6 = __cxa_allocate_exception(0x28);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_2d60,"XMAISM08 This should never happen.",
                                           &local_2d61);
                                SPxInternalCodeException::SPxInternalCodeException
                                          ((SPxInternalCodeException *)in_stack_ffffffffffffc440,
                                           (string *)in_stack_ffffffffffffc438);
                                local_2d62 = 0;
                                __cxa_throw(uVar6,&SPxInternalCodeException::typeinfo,
                                            SPxInternalCodeException::~SPxInternalCodeException);
                              }
                              bVar2 = boost::multiprecision::operator==
                                                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffc438,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x5a4cd4);
                              VVar8 = ON_LOWER;
                              if (bVar2) {
                                VVar8 = FIXED;
                              }
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,(int)in_RDI[5]);
                              *pVVar5 = VVar8;
                              plVar11 = in_RDI + 6;
                              local_db8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_dc0 = plVar11;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                              pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0x2e);
                              local_708 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_6f8 = local_2d40;
                              local_700 = pnVar4;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_709,pnVar4,local_708);
                              local_6f0 = local_2d40;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_6d8 = local_2d40;
                              local_6e0 = local_700;
                              local_6e8 = local_708;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a4e43);
                              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)in_stack_ffffffffffffc440,
                                           (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              boost::multiprecision::
                              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              ::operator-=(in_stack_ffffffffffffc460,in_stack_ffffffffffffc458);
                            }
                            else {
                              bVar2 = boost::multiprecision::operator==
                                                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffc438,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x5a483d);
                              VVar8 = ON_LOWER;
                              if (bVar2) {
                                VVar8 = FIXED;
                              }
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                              *pVVar5 = VVar8;
                              local_da8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_db0 = in_RDI + 0x1a;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,(int)in_RDI[5]);
                              *pVVar5 = BASIC;
                              local_678 = &local_2bb0;
                              local_680 = &local_1db0;
                              local_688 = &local_1bac;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_689,local_680,local_688);
                              local_670 = &local_2bb0;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_658 = &local_2bb0;
                              local_660 = local_680;
                              local_668 = local_688;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a49ab);
                              local_bc8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x2e);
                              local_bb8 = local_2b60;
                              local_bc0 = &local_2bb0;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_bc9,local_bc0,local_bc8);
                              local_bb0 = local_2b60;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_b98 = local_2b60;
                              local_ba0 = local_bc0;
                              local_ba8 = local_bc8;
                              boost::multiprecision::default_ops::
                              eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a4a68);
                              local_e38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_e40 = local_2b60;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                            }
                          }
                          else {
                            bVar2 = boost::multiprecision::operator==
                                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)in_stack_ffffffffffffc438,
                                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)0x5a43ac);
                            VVar8 = ON_LOWER;
                            if (bVar2) {
                              VVar8 = FIXED;
                            }
                            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                     ::operator[](local_1200,(int)in_RDI[5]);
                            *pVVar5 = VVar8;
                            local_d98 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                            local_da0 = in_RDI + 6;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                            pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)(in_RDI + 0x2e);
                            local_608 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                            local_5f8 = local_2978;
                            local_600 = pnVar4;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_609,pnVar4,local_608);
                            local_5f0 = local_2978;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffc440);
                            local_5d8 = local_2978;
                            local_5e0 = local_600;
                            local_5e8 = local_608;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                       (cpp_dec_float<100U,_int,_void> *)0x5a451b);
                            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffc440,
                                         (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                            boost::multiprecision::
                            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            ::operator-=(in_stack_ffffffffffffc460,in_stack_ffffffffffffc458);
                          }
                        }
                        else {
                          bVar2 = boost::multiprecision::operator==
                                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)in_stack_ffffffffffffc438,
                                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x5a3e4a);
                          VVar8 = ON_UPPER;
                          if (bVar2) {
                            VVar8 = FIXED;
                          }
                          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                          *pVVar5 = VVar8;
                          local_d88 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                          local_d90 = in_RDI + 0x24;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   ::operator[](local_1200,(int)in_RDI[5]);
                          *pVVar5 = BASIC;
                          local_578 = &local_2790;
                          local_580 = &local_1ea0;
                          local_588 = &local_1c9c;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_589,local_580,local_588);
                          local_570 = &local_2790;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440);
                          local_558 = &local_2790;
                          local_560 = local_580;
                          local_568 = local_588;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                     (cpp_dec_float<100U,_int,_void> *)0x5a3fb5);
                          local_b88 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x2e);
                          local_b78 = local_2740;
                          local_b80 = &local_2790;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_b89,local_b80,local_b88);
                          local_b70 = local_2740;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440);
                          local_b58 = local_2740;
                          local_b60 = local_b80;
                          local_b68 = local_b88;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                     (cpp_dec_float<100U,_int,_void> *)0x5a4072);
                          local_e28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                          local_e30 = local_2740;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                        }
                      }
                      else {
                        bVar2 = boost::multiprecision::operator==
                                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)in_stack_ffffffffffffc438,
                                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x5a39e5);
                        VVar8 = ON_UPPER;
                        if (bVar2) {
                          VVar8 = FIXED;
                        }
                        pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                 ::operator[](local_1200,(int)in_RDI[5]);
                        *pVVar5 = VVar8;
                        local_d78 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                 (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                        local_d80 = in_RDI + 0x10;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                        local_508 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                 (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                        local_4f8 = local_2560;
                        local_500 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x2e);
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_509,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x2e),local_508);
                        local_4f0 = local_2560;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffc440);
                        local_4d8 = local_2560;
                        local_4e0 = local_500;
                        local_4e8 = local_508;
                        boost::multiprecision::default_ops::
                        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                   (cpp_dec_float<100U,_int,_void> *)0x5a3b54);
                        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffc440,
                                     (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                        boost::multiprecision::
                        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        ::operator-=(in_stack_ffffffffffffc460,in_stack_ffffffffffffc458);
                      }
                    }
                  }
                  else {
                    local_ed0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              *)in_stack_ffffffffffffc440,iVar9);
                    local_ec8 = local_2db4;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                    local_740 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x2e);
                    local_748 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 6);
                    local_738 = &local_2e54;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_749,local_740,local_748);
                    local_730 = &local_2e54;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffc440);
                    local_718 = &local_2e54;
                    local_720 = local_740;
                    local_728 = local_748;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                              (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                               (cpp_dec_float<100U,_int,_void> *)0x5a5081);
                    local_1a8 = local_2e04;
                    local_1b8 = &local_2e54;
                    local_1b0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x24);
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_1b9,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(in_RDI + 0x24),local_1b8);
                    local_1a0 = local_2e04;
                    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffc440);
                    local_188 = local_2e04;
                    local_190 = local_1b0;
                    local_198 = local_1b8;
                    boost::multiprecision::default_ops::
                    eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                              (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                               (cpp_dec_float<100U,_int,_void> *)0x5a5138);
                    (**(code **)(*in_RDI + 0x38))(local_2ea4);
                    bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                       in_stack_ffffffffffffc580);
                    if (bVar2) {
                      bVar2 = boost::multiprecision::operator==
                                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)in_stack_ffffffffffffc438,
                                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)0x5a518f);
                      VVar8 = ON_LOWER;
                      if (bVar2) {
                        VVar8 = FIXED;
                      }
                      pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                               ::operator[](local_1200,(int)in_RDI[5]);
                      *pVVar5 = VVar8;
                      local_dc8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffc440,
                                               (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                      local_dd0 = in_RDI + 6;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                      local_788 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffc440,
                                               (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                      local_778 = local_2ef4;
                      local_780 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x2e);
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_789,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x2e),local_788);
                      local_770 = local_2ef4;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440);
                      local_758 = local_2ef4;
                      local_760 = local_780;
                      local_768 = local_788;
                      boost::multiprecision::default_ops::
                      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                 (cpp_dec_float<100U,_int,_void> *)0x5a52fe);
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffc440,
                                   (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                      boost::multiprecision::
                      number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      ::operator-=(in_stack_ffffffffffffc460,in_stack_ffffffffffffc458);
                    }
                    else {
                      local_ec0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffc440,
                                               (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                      local_eb8 = local_2f44;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(in_RDI + 0x1a);
                      local_7c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x2e);
                      local_7c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 6);
                      local_7b8 = &local_2fe4;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_7c9,local_7c0,local_7c8);
                      local_7b0 = &local_2fe4;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440);
                      local_798 = &local_2fe4;
                      local_7a0 = local_7c0;
                      local_7a8 = local_7c8;
                      boost::multiprecision::default_ops::
                      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                 (cpp_dec_float<100U,_int,_void> *)0x5a543f);
                      local_1e8 = local_2f94;
                      local_1f8 = &local_2fe4;
                      local_1f0 = pnVar4;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_1f9,pnVar4,local_1f8);
                      local_1e0 = local_2f94;
                      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffc440);
                      local_1c8 = local_2f94;
                      local_1d0 = local_1f0;
                      local_1d8 = local_1f8;
                      boost::multiprecision::default_ops::
                      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                 (cpp_dec_float<100U,_int,_void> *)0x5a54f6);
                      (**(code **)(*in_RDI + 0x38))(local_3034);
                      bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                         in_stack_ffffffffffffc580);
                      local_3afd = false;
                      if (bVar2) {
                        puVar7 = (ulong *)infinity();
                        local_3090 = *puVar7 ^ 0x8000000000000000;
                        local_10a0 = local_3084;
                        local_10a8 = &local_3090;
                        local_10b0 = 0;
                        local_cb8 = local_10a8;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<100U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                                   (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                        local_3afd = boost::multiprecision::operator>
                                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)in_stack_ffffffffffffc438,
                                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)0x5a55e9);
                      }
                      if (local_3afd == false) {
                        local_eb0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                 (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                        local_ea8 = local_3130;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                        local_840 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x2e);
                        local_848 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x10);
                        local_838 = &local_31d0;
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_849,local_840,local_848);
                        local_830 = &local_31d0;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffc440);
                        local_818 = &local_31d0;
                        local_820 = local_840;
                        local_828 = local_848;
                        boost::multiprecision::default_ops::
                        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                   (cpp_dec_float<100U,_int,_void> *)0x5a58cd);
                        local_228 = local_3180;
                        local_238 = &local_31d0;
                        local_230 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x24);
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_239,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x24),local_238);
                        local_220 = local_3180;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffc440);
                        local_208 = local_3180;
                        local_210 = local_230;
                        local_218 = local_238;
                        boost::multiprecision::default_ops::
                        eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                   (cpp_dec_float<100U,_int,_void> *)0x5a5984);
                        (**(code **)(*in_RDI + 0x38))(local_3220);
                        bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                          (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                           in_stack_ffffffffffffc580);
                        tVar1 = false;
                        if (bVar2) {
                          local_1090 = infinity();
                          local_1088 = local_3270;
                          local_1098 = 0;
                          local_cc0 = local_1090;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<100U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450),
                                     (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440);
                          tVar1 = boost::multiprecision::operator<
                                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)in_stack_ffffffffffffc438,
                                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x5a5a4d);
                        }
                        if (tVar1 == false) {
                          local_ea0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                          local_e98 = local_3360;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                          local_8c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x2e);
                          local_8c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x10);
                          local_8b8 = &local_3400;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_8c9,local_8c0,local_8c8);
                          local_8b0 = &local_3400;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440);
                          local_898 = &local_3400;
                          local_8a0 = local_8c0;
                          local_8a8 = local_8c8;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                     (cpp_dec_float<100U,_int,_void> *)0x5a5e07);
                          local_268 = local_33b0;
                          local_278 = &local_3400;
                          local_270 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x1a);
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_279,
                                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)(in_RDI + 0x1a),local_278);
                          local_260 = local_33b0;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440);
                          local_248 = local_33b0;
                          local_250 = local_270;
                          local_258 = local_278;
                          boost::multiprecision::default_ops::
                          eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                     (cpp_dec_float<100U,_int,_void> *)0x5a5ebb);
                          (**(code **)(*in_RDI + 0x38))(local_3450);
                          bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                            (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                             in_stack_ffffffffffffc580);
                          local_3b45 = false;
                          if (bVar2) {
                            local_1078 = infinity();
                            local_1070 = local_34a0;
                            local_1080 = 0;
                            local_cc8 = local_1078;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<100U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffc454,in_stack_ffffffffffffc450)
                                       ,(double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440)
                            ;
                            local_3b45 = boost::multiprecision::operator<
                                                   ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffc438,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x5a5f7e);
                          }
                          if (local_3b45 == false) {
                            local_e90 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                            local_e88 = local_3540;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                            local_940 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x2e);
                            local_948 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x10);
                            local_938 = &local_35e0;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_949,local_940,local_948);
                            local_930 = &local_35e0;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffc440);
                            local_918 = &local_35e0;
                            local_920 = local_940;
                            local_928 = local_948;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                       (cpp_dec_float<100U,_int,_void> *)0x5a624d);
                            local_2a8 = local_3590;
                            local_2b8 = &local_35e0;
                            local_2b0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x1a);
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_2b9,
                                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0x1a),local_2b8);
                            local_2a0 = local_3590;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffc440);
                            local_288 = local_3590;
                            local_290 = local_2b0;
                            local_298 = local_2b8;
                            boost::multiprecision::default_ops::
                            eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                       (cpp_dec_float<100U,_int,_void> *)0x5a6301);
                            (**(code **)(*in_RDI + 0x38))(local_3630);
                            bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                              (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588,
                                               in_stack_ffffffffffffc580);
                            local_3b6d = false;
                            if (bVar2) {
                              puVar7 = (ulong *)infinity();
                              local_3688 = *puVar7 ^ 0x8000000000000000;
                              local_1058 = local_3680;
                              local_1060 = &local_3688;
                              local_1068 = 0;
                              local_cd0 = local_1060;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float<double>
                                        ((cpp_dec_float<100U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffc454,
                                                  in_stack_ffffffffffffc450),
                                         (double)in_stack_ffffffffffffc448,in_stack_ffffffffffffc440
                                        );
                              local_3b6d = boost::multiprecision::operator>
                                                     ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffc438,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x5a63ed);
                            }
                            if (local_3b6d == false) {
                              local_e80 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_e78 = local_3778;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                              local_9c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x2e);
                              local_9c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x10);
                              local_9b8 = &local_3818;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_9c9,local_9c0,local_9c8);
                              local_9b0 = &local_3818;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_998 = &local_3818;
                              local_9a0 = local_9c0;
                              local_9a8 = local_9c8;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a6798);
                              local_2e8 = local_37c8;
                              local_2f8 = &local_3818;
                              local_2f0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x1a);
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_2f9,
                                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)(in_RDI + 0x1a),local_2f8);
                              local_2e0 = local_37c8;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_2c8 = local_37c8;
                              local_2d0 = local_2f0;
                              local_2d8 = local_2f8;
                              boost::multiprecision::default_ops::
                              eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a684c);
                              (**(code **)(*in_RDI + 0x38))(local_3868);
                              bVar2 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                                (in_stack_ffffffffffffc590,in_stack_ffffffffffffc588
                                                 ,in_stack_ffffffffffffc580);
                              if (!bVar2) {
                                local_38da = 1;
                                this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28)
                                ;
                                paVar10 = &local_38d9;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_38d8,"XMAISM09 This should never happen.",paVar10);
                                SPxInternalCodeException::SPxInternalCodeException
                                          (this_00,(string *)in_stack_ffffffffffffc438);
                                local_38da = 0;
                                __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                                            SPxInternalCodeException::~SPxInternalCodeException);
                              }
                              bVar2 = boost::multiprecision::operator==
                                                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffc438,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x5a68a3);
                              VVar8 = ON_UPPER;
                              if (bVar2) {
                                VVar8 = FIXED;
                              }
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,(int)in_RDI[5]);
                              *pVVar5 = VVar8;
                              val = (self_type *)(in_RDI + 0x10);
                              local_e18 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_e20 = val;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                              pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0x2e);
                              local_a08 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_9f8 = local_38b8;
                              local_a00 = pnVar4;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_a09,pnVar4,local_a08);
                              local_9f0 = local_38b8;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_9d8 = local_38b8;
                              local_9e0 = local_a00;
                              local_9e8 = local_a08;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a6a00);
                              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)in_stack_ffffffffffffc440,
                                           (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              boost::multiprecision::
                              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              ::operator-=(pnVar4,val);
                            }
                            else {
                              bVar2 = boost::multiprecision::operator==
                                                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffc438,
                                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x5a641c);
                              VVar8 = ON_LOWER;
                              if (bVar2) {
                                VVar8 = FIXED;
                              }
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                              *pVVar5 = VVar8;
                              local_e08 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_e10 = in_RDI + 0x1a;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,(int)in_RDI[5]);
                              *pVVar5 = BASIC;
                              local_978 = &local_3728;
                              local_980 = &local_1db0;
                              local_988 = &local_1bac;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_989,local_980,local_988);
                              local_970 = &local_3728;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_958 = &local_3728;
                              local_960 = local_980;
                              local_968 = local_988;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a657e);
                              local_c48 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x2e);
                              local_c38 = local_36d8;
                              local_c40 = &local_3728;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_c49,local_c40,local_c48);
                              local_c30 = local_36d8;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffc440);
                              local_c18 = local_36d8;
                              local_c20 = local_c40;
                              local_c28 = local_c48;
                              boost::multiprecision::default_ops::
                              eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                        (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                         (cpp_dec_float<100U,_int,_void> *)0x5a663b);
                              local_e58 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                              local_e60 = local_36d8;
                              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                              operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                            }
                          }
                          else {
                            bVar2 = boost::multiprecision::operator==
                                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)in_stack_ffffffffffffc438,
                                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)0x5a5fb0);
                            VVar8 = ON_UPPER;
                            if (bVar2) {
                              VVar8 = FIXED;
                            }
                            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                     ::operator[](local_1200,(int)in_RDI[5]);
                            *pVVar5 = VVar8;
                            local_df8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                            local_e00 = in_RDI + 0x10;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                            local_908 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                            local_8f8 = local_34f0;
                            local_900 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x2e);
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_909,
                                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0x2e),local_908);
                            local_8f0 = local_34f0;
                            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffc440);
                            local_8d8 = local_34f0;
                            local_8e0 = local_900;
                            local_8e8 = local_908;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                      (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                       (cpp_dec_float<100U,_int,_void> *)0x5a610d);
                            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffc440,
                                         (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                            boost::multiprecision::
                            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            ::operator-=(in_stack_ffffffffffffc460,in_stack_ffffffffffffc458);
                          }
                        }
                        else {
                          bVar2 = boost::multiprecision::operator==
                                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)in_stack_ffffffffffffc438,
                                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x5a5a82);
                          VVar8 = ON_UPPER;
                          if (bVar2) {
                            VVar8 = FIXED;
                          }
                          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                          *pVVar5 = VVar8;
                          local_de8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                          local_df0 = in_RDI + 0x24;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   ::operator[](local_1200,(int)in_RDI[5]);
                          *pVVar5 = BASIC;
                          local_878 = &local_3310;
                          local_880 = &local_1ea0;
                          local_888 = &local_1c9c;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_889,local_880,local_888);
                          local_870 = &local_3310;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440);
                          local_858 = &local_3310;
                          local_860 = local_880;
                          local_868 = local_888;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                     (cpp_dec_float<100U,_int,_void> *)0x5a5bed);
                          local_c08 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x2e);
                          local_bf8 = local_32c0;
                          local_c00 = &local_3310;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_c09,local_c00,local_c08);
                          local_bf0 = local_32c0;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffc440);
                          local_bd8 = local_32c0;
                          local_be0 = local_c00;
                          local_be8 = local_c08;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                     (cpp_dec_float<100U,_int,_void> *)0x5a5caa);
                          local_e48 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                  (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                          local_e50 = local_32c0;
                          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                        }
                      }
                      else {
                        bVar2 = boost::multiprecision::operator==
                                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)in_stack_ffffffffffffc438,
                                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x5a561b);
                        VVar8 = ON_LOWER;
                        if (bVar2) {
                          VVar8 = FIXED;
                        }
                        pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                 ::operator[](local_1200,(int)in_RDI[5]);
                        *pVVar5 = VVar8;
                        plVar11 = in_RDI + 6;
                        local_dd8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                 (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                        local_de0 = plVar11;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
                        local_808 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffc440,
                                                 (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                        local_7f8 = local_30e0;
                        local_800 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x2e);
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_809,
                                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x2e),local_808);
                        local_7f0 = local_30e0;
                        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffc440);
                        local_7d8 = local_30e0;
                        local_7e0 = local_800;
                        local_7e8 = local_808;
                        boost::multiprecision::default_ops::
                        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                                  (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438,
                                   (cpp_dec_float<100U,_int,_void> *)0x5a578a);
                        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffc440,
                                     (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                        boost::multiprecision::
                        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        ::operator-=(in_stack_ffffffffffffc460,in_stack_ffffffffffffc458);
                      }
                    }
                  }
                }
                else {
                  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                           ::operator[](local_1200,(int)in_RDI[5]);
                  *pVVar5 = ZERO;
                  local_21e8 = 0;
                  local_408 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)in_stack_ffffffffffffc440,
                                           (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
                  local_410 = &local_21e8;
                  local_400 = local_410;
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            (in_stack_ffffffffffffc4f8,in_stack_ffffffffffffc4f0);
                }
              }
            }
          }
        }
      }
      u = (cpp_dec_float<100U,_int,_void> *)(in_RDI + 0x2e);
      local_a48 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffc440,(int)((ulong)u >> 0x20));
      local_a38 = local_392c;
      local_a40 = u;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_a49,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)u,local_a48);
      local_a30 = local_392c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffc440);
      local_a18 = local_392c;
      local_a20 = local_a40;
      local_a28 = local_a48;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (in_stack_ffffffffffffc440,u,(cpp_dec_float<100U,_int,_void> *)0x5a6bf2);
      local_e68 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffc440,(int)((ulong)u >> 0x20));
      local_e70 = local_392c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_stack_ffffffffffffc440,u);
    }
    else {
      local_1208 = DataArray<int>::size((DataArray<int> *)(in_RDI + 0x39));
      while (local_1208 = local_1208 + -1, -1 < local_1208) {
        piVar3 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x39),local_1208);
        if (-1 < *piVar3) {
          piVar3 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x39),local_1208);
          local_120c = *piVar3;
          local_1210 = local_1208;
          pnVar4 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_ffffffffffffc440,
                                (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
          local_cd8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffc440,
                                   (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
          local_ce0 = pnVar4;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
          pnVar4 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_ffffffffffffc440,
                                (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
          local_ce8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffc440,
                                   (int)((ulong)in_stack_ffffffffffffc438 >> 0x20));
          local_cf0 = pnVar4;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,local_120c);
          VVar8 = *pVVar5;
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,local_1210);
          *pVVar5 = VVar8;
        }
      }
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}